

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall QGraphicsScene::setBackgroundBrush(QGraphicsScene *this,QBrush *brush)

{
  long lVar1;
  long lVar2;
  QGraphicsView *this_00;
  QWidget *this_01;
  long lVar3;
  long in_FS_OFFSET;
  QRectF local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  QBrush::operator=((QBrush *)(lVar1 + 0x170),brush);
  lVar2 = *(long *)(lVar1 + 0x288);
  lVar1 = *(long *)(lVar1 + 0x290);
  for (lVar3 = 0; lVar1 << 3 != lVar3; lVar3 = lVar3 + 8) {
    this_00 = *(QGraphicsView **)(lVar2 + lVar3);
    QGraphicsView::resetCachedContent(this_00);
    this_01 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this_00);
    QWidget::update(this_01);
  }
  local_58.w = 0.0;
  local_58.h = 0.0;
  local_58.xp = 0.0;
  local_58.yp = 0.0;
  update(this,&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::setBackgroundBrush(const QBrush &brush)
{
    Q_D(QGraphicsScene);
    d->backgroundBrush = brush;
    for (QGraphicsView *view : std::as_const(d->views)) {
        view->resetCachedContent();
        view->viewport()->update();
    }
    update();
}